

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_export.c
# Opt level: O0

REF_STATUS ref_export_tec_metric_ellipse(REF_GRID ref_grid,char *root_filename)

{
  REF_NODE ref_node_00;
  REF_CELL ref_cell_00;
  REF_STATUS RVar1;
  int iVar2;
  uint uVar3;
  void *__ptr;
  void *__ptr_00;
  double dVar4;
  double dVar5;
  double dVar6;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_INT ref_malloc_init_i;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL scale;
  REF_DBL dt;
  REF_INT e1;
  REF_INT e0;
  REF_INT n;
  REF_INT i;
  char viz_file [256];
  FILE *file;
  REF_DBL ey;
  REF_DBL ex;
  REF_DBL z;
  REF_DBL y;
  REF_DBL x;
  REF_DBL d [12];
  REF_DBL m [6];
  REF_INT nodes [27];
  int local_50;
  REF_INT cell;
  REF_INT ncell;
  REF_INT *n2o;
  REF_INT *o2n;
  REF_INT node;
  REF_INT nnode;
  REF_CELL ref_cell;
  REF_NODE ref_node;
  char *root_filename_local;
  REF_GRID ref_grid_local;
  
  ref_node_00 = ref_grid->node;
  ref_cell_00 = ref_grid->cell[3];
  if (ref_grid->twod == 0) {
    snprintf((char *)&n,0x100,"%s_n%d_p%d_ellipse.tec",root_filename,(ulong)(uint)ref_grid->mpi->n,
             (ulong)(uint)ref_grid->mpi->id);
    viz_file._248_8_ = fopen((char *)&n,"w");
    if ((FILE *)viz_file._248_8_ == (FILE *)0x0) {
      printf("unable to open %s\n",&n);
    }
    if (viz_file._248_8_ == 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
             0x39a,"ref_export_tec_metric_ellipse","unable to open file");
      ref_grid_local._4_4_ = 2;
    }
    else {
      fprintf((FILE *)viz_file._248_8_,"title=\"tecplot refine metric axes\"\n");
      fprintf((FILE *)viz_file._248_8_,"variables = \"x\" \"y\" \"z\"\n");
      if (ref_node_00->max < 0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
               0x39f,"ref_export_tec_metric_ellipse","malloc o2n of REF_INT negative");
        ref_grid_local._4_4_ = 1;
      }
      else {
        __ptr = malloc((long)ref_node_00->max << 2);
        if (__ptr == (void *)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
                 0x39f,"ref_export_tec_metric_ellipse","malloc o2n of REF_INT NULL");
          ref_grid_local._4_4_ = 2;
        }
        else {
          for (ref_private_macro_code_rss_2 = 0; ref_private_macro_code_rss_2 < ref_node_00->max;
              ref_private_macro_code_rss_2 = ref_private_macro_code_rss_2 + 1) {
            *(undefined4 *)((long)__ptr + (long)ref_private_macro_code_rss_2 * 4) = 0xffffffff;
          }
          o2n._4_4_ = 0;
          for (local_50 = 0; local_50 < ref_cell_00->max; local_50 = local_50 + 1) {
            RVar1 = ref_cell_nodes(ref_cell_00,local_50,(REF_INT *)(m + 5));
            if (RVar1 == 0) {
              for (o2n._0_4_ = 0; (int)o2n < ref_cell_00->node_per; o2n._0_4_ = (int)o2n + 1) {
                if (*(int *)((long)__ptr + (long)nodes[(long)(int)o2n + -2] * 4) == -1) {
                  *(int *)((long)__ptr + (long)nodes[(long)(int)o2n + -2] * 4) = o2n._4_4_;
                  o2n._4_4_ = o2n._4_4_ + 1;
                }
              }
            }
          }
          if (o2n._4_4_ < 0) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                   ,0x3aa,"ref_export_tec_metric_ellipse","malloc n2o of REF_INT negative");
            ref_grid_local._4_4_ = 1;
          }
          else {
            __ptr_00 = malloc((long)o2n._4_4_ << 2);
            if (__ptr_00 == (void *)0x0) {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                     ,0x3aa,"ref_export_tec_metric_ellipse","malloc n2o of REF_INT NULL");
              ref_grid_local._4_4_ = 2;
            }
            else {
              for (o2n._0_4_ = 0; (int)o2n < ref_node_00->max; o2n._0_4_ = (int)o2n + 1) {
                if (*(int *)((long)__ptr + (long)(int)o2n * 4) != -1) {
                  *(int *)((long)__ptr_00 + (long)*(int *)((long)__ptr + (long)(int)o2n * 4) * 4) =
                       (int)o2n;
                }
              }
              iVar2 = o2n._4_4_ * 0x24;
              fprintf((FILE *)viz_file._248_8_,
                      "zone t=\"ellipse\", nodes=%d, elements=%d, datapacking=%s, zonetype=%s\n",
                      (ulong)(uint)(o2n._4_4_ * 0x6c),(ulong)(uint)(o2n._4_4_ * 0x6c),"point",
                      "felineseg");
              for (o2n._0_4_ = 0; (int)o2n < o2n._4_4_; o2n._0_4_ = (int)o2n + 1) {
                uVar3 = ref_node_metric_get(ref_node_00,
                                            *(REF_INT *)((long)__ptr_00 + (long)(int)o2n * 4),
                                            d + 0xb);
                if (uVar3 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                         ,0x3b9,"ref_export_tec_metric_ellipse",(ulong)uVar3,"get");
                  return uVar3;
                }
                uVar3 = ref_matrix_diag_m(d + 0xb,&x);
                if (uVar3 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                         ,0x3ba,"ref_export_tec_metric_ellipse",(ulong)uVar3,"diag");
                  return uVar3;
                }
                uVar3 = ref_matrix_descending_eig(&x);
                if (uVar3 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                         ,0x3bb,"ref_export_tec_metric_ellipse",(ulong)uVar3,"sort eig");
                  return uVar3;
                }
                for (dt._4_4_ = 0; dt._4_4_ < 3; dt._4_4_ = dt._4_4_ + 1) {
                  dt._0_4_ = dt._4_4_ + 1;
                  if (dt._0_4_ == 3) {
                    dt._0_4_ = 0;
                  }
                  for (e0 = 0; e0 < 0x24; e0 = e0 + 1) {
                    dVar4 = cos((double)e0 * 0.17453292519943278);
                    dVar5 = sqrt(d[(long)dt._4_4_ + -1]);
                    dVar5 = (dVar4 * 0.5) / dVar5;
                    dVar4 = sin((double)e0 * 0.17453292519943278);
                    dVar6 = sqrt(d[(long)dt._0_4_ + -1]);
                    dVar6 = (dVar4 * 0.5) / dVar6;
                    fprintf((FILE *)viz_file._248_8_," %.16e %.16e %.16e\n",
                            ref_node_00->real[*(int *)((long)__ptr_00 + (long)(int)o2n * 4) * 0xf] +
                            d[(long)(dt._4_4_ * 3 + 3) + -1] * dVar5 +
                            d[(long)(dt._0_4_ * 3 + 3) + -1] * dVar6,
                            ref_node_00->real
                            [*(int *)((long)__ptr_00 + (long)(int)o2n * 4) * 0xf + 1] +
                            d[(long)(dt._4_4_ * 3 + 4) + -1] * dVar5 +
                            d[(long)(dt._0_4_ * 3 + 4) + -1] * dVar6,
                            ref_node_00->real
                            [*(int *)((long)__ptr_00 + (long)(int)o2n * 4) * 0xf + 2] +
                            d[(long)(dt._4_4_ * 3 + 5) + -1] * dVar5 +
                            d[(long)(dt._0_4_ * 3 + 5) + -1] * dVar6);
                  }
                }
              }
              for (dt._4_4_ = 0; dt._4_4_ < 3; dt._4_4_ = dt._4_4_ + 1) {
                for (o2n._0_4_ = 0; (int)o2n < o2n._4_4_; o2n._0_4_ = (int)o2n + 1) {
                  for (e0 = 0; e0 < 0x23; e0 = e0 + 1) {
                    fprintf((FILE *)viz_file._248_8_," %d %d\n",
                            (ulong)(uint)(e0 + (int)o2n * 0x24 + 1 + iVar2 * dt._4_4_),
                            (ulong)(uint)(e0 + (int)o2n * 0x24 + 2 + iVar2 * dt._4_4_));
                  }
                  fprintf((FILE *)viz_file._248_8_," %d %d\n",
                          (ulong)(uint)((int)o2n * 0x24 + 0x24 + iVar2 * dt._4_4_),
                          (ulong)(uint)((int)o2n * 0x24 + 1 + iVar2 * dt._4_4_));
                }
              }
              if (__ptr_00 != (void *)0x0) {
                free(__ptr_00);
              }
              if (__ptr != (void *)0x0) {
                free(__ptr);
              }
              ref_grid_local._4_4_ = ref_export_tec_surf_zone(ref_grid,(FILE *)viz_file._248_8_);
              if (ref_grid_local._4_4_ == 0) {
                fclose((FILE *)viz_file._248_8_);
                ref_grid_local._4_4_ = 0;
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                       ,0x3d9,"ref_export_tec_metric_ellipse",(ulong)ref_grid_local._4_4_,
                       "ellipse surf");
              }
            }
          }
        }
      }
    }
  }
  else {
    ref_grid_local._4_4_ = ref_export_tec_metric_ellipse_twod(ref_grid,root_filename);
    if (ref_grid_local._4_4_ == 0) {
      ref_grid_local._4_4_ = 0;
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
             0x390,"ref_export_tec_metric_ellipse",(ulong)ref_grid_local._4_4_,"2d met");
    }
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_export_tec_metric_ellipse(REF_GRID ref_grid,
                                                 const char *root_filename) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_INT nnode, node;
  REF_INT *o2n, *n2o;
  REF_INT ncell, cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_DBL m[6], d[12];
  REF_DBL x, y, z;
  REF_DBL ex, ey;
  FILE *file;
  char viz_file[256];
  REF_INT i, n = 36;
  REF_INT e0, e1;
  REF_DBL dt = ref_math_in_radians(360.0 / (REF_DBL)n);
  REF_DBL scale = 0.5; /* so the ellipses touch for an ideal grid */

  if (ref_grid_twod(ref_grid)) {
    RSS(ref_export_tec_metric_ellipse_twod(ref_grid, root_filename), "2d met");
    return REF_SUCCESS;
  }

  snprintf(viz_file, 256, "%s_n%d_p%d_ellipse.tec", root_filename,
           ref_mpi_n(ref_grid_mpi(ref_grid)),
           ref_mpi_rank(ref_grid_mpi(ref_grid)));

  file = fopen(viz_file, "w");
  if (NULL == (void *)file) printf("unable to open %s\n", viz_file);
  RNS(file, "unable to open file");

  fprintf(file, "title=\"tecplot refine metric axes\"\n");
  fprintf(file, "variables = \"x\" \"y\" \"z\"\n");

  ref_malloc_init(o2n, ref_node_max(ref_node), REF_INT, REF_EMPTY);
  nnode = 0;
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
      if (REF_EMPTY == o2n[nodes[node]]) {
        o2n[nodes[node]] = nnode;
        nnode++;
      }
    }
  }

  ref_malloc(n2o, nnode, REF_INT);
  for (node = 0; node < ref_node_max(ref_node); node++) {
    if (REF_EMPTY != o2n[node]) {
      n2o[o2n[node]] = node;
    }
  }

  ncell = nnode * n;

  fprintf(file,
          "zone t=\"ellipse\", nodes=%d, elements=%d, datapacking=%s, "
          "zonetype=%s\n",
          3 * ncell, 3 * ncell, "point", "felineseg");

  for (node = 0; node < nnode; node++) {
    RSS(ref_node_metric_get(ref_node, n2o[node], m), "get");
    RSS(ref_matrix_diag_m(m, d), "diag");
    RSS(ref_matrix_descending_eig(d), "sort eig");
    for (e0 = 0; e0 < 3; e0++) {
      e1 = e0 + 1;
      if (e1 == 3) e1 = 0;
      for (i = 0; i < n; i++) {
        ex = scale * cos(i * dt) / sqrt(d[e0]);
        ey = scale * sin(i * dt) / sqrt(d[e1]);
        x = d[3 + 3 * e0] * ex + d[3 + 3 * e1] * ey;
        y = d[4 + 3 * e0] * ex + d[4 + 3 * e1] * ey;
        z = d[5 + 3 * e0] * ex + d[5 + 3 * e1] * ey;
        fprintf(file, " %.16e %.16e %.16e\n",
                ref_node_xyz(ref_node, 0, n2o[node]) + x,
                ref_node_xyz(ref_node, 1, n2o[node]) + y,
                ref_node_xyz(ref_node, 2, n2o[node]) + z);
      }
    }
  }

  for (e0 = 0; e0 < 3; e0++)
    for (node = 0; node < nnode; node++) {
      for (i = 0; i < n - 1; i++)
        fprintf(file, " %d %d\n", i + node * n + 1 + ncell * e0,
                i + 1 + node * n + 1 + ncell * e0);
      fprintf(file, " %d %d\n", n + node * n + ncell * e0,
              1 + node * n + ncell * e0);
    }

  ref_free(n2o);
  ref_free(o2n);

  RSS(ref_export_tec_surf_zone(ref_grid, file), "ellipse surf");

  fclose(file);

  return REF_SUCCESS;
}